

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O2

add_torrent_params *
libtorrent::parse_magnet_uri
          (add_torrent_params *__return_storage_ptr__,string_view uri,error_code *ec)

{
  error_code *in_R8;
  string_view uri_00;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  local_40[1] = (code *)0x0;
  local_40[0] = default_storage_constructor;
  local_28 = std::
             _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
             ::_M_manager;
  add_torrent_params::add_torrent_params
            (__return_storage_ptr__,(storage_constructor_type *)local_40);
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  uri_00.len_ = (size_t)__return_storage_ptr__;
  uri_00.ptr_ = (char *)uri.len_;
  parse_magnet_uri((libtorrent *)uri.ptr_,uri_00,(add_torrent_params *)ec,in_R8);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri, error_code& ec)
	{
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		return ret;
	}